

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall TextReaderTest_InvalidFormat_Test::TestBody(TextReaderTest_InvalidFormat_Test *this)

{
  StringRef line;
  undefined1 uVar1;
  bool bVar2;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  char *in_stack_fffffffffffffe18;
  BasicStringRef<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  Type in_stack_fffffffffffffe4c;
  AssertionResult *in_stack_fffffffffffffe50;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe60;
  Message *in_stack_fffffffffffffe98;
  AssertHelper *in_stack_fffffffffffffea0;
  int in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa8 [14];
  byte bVar3;
  allocator<char> in_stack_ffffffffffffffb7;
  string local_48 [48];
  AssertionResult local_18;
  
  this_00 = &local_18;
  testing::AssertionSuccess();
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if ((bool)uVar1) {
    in_stack_fffffffffffffe50 = (AssertionResult *)&stack0xffffffffffffffb7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffe60),&this_00->success_,
               (allocator<char> *)in_stack_fffffffffffffe50);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    bVar3 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffe4c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe4c);
    if (bVar2) {
      fmt::BasicStringRef<char>::BasicStringRef(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
      ;
      line.size_._6_1_ = bVar3;
      line._0_14_ = in_stack_ffffffffffffffa8;
      line.size_._7_1_ = in_stack_ffffffffffffffb7;
      ReadHeader(in_stack_ffffffffffffffa4,line);
    }
    bVar2 = (bVar3 & 1) != 0;
    if (!bVar2) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffe50,
                 (char (*) [97])CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    std::__cxx11::string::~string(local_48);
    if (bVar2) goto LAB_00140a35;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffe50);
  testing::AssertionResult::failure_message((AssertionResult *)0x1409a7);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
  testing::Message::~Message((Message *)0x1409f3);
LAB_00140a35:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x140a42);
  return;
}

Assistant:

TEST(TextReaderTest, InvalidFormat) {
  EXPECT_THROW_MSG(ReadHeader(0, "x"),
      ReadError, "(input):1:1: expected format specifier");
}